

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O0

void __thiscall EventLoopThread::EventLoopThread(EventLoopThread *this)

{
  allocator local_91;
  string local_90;
  EventLoopThread *local_60;
  code *local_58;
  undefined8 local_50;
  type local_48;
  ThreadFunc local_30;
  EventLoopThread *local_10;
  EventLoopThread *this_local;
  
  local_10 = this;
  noncopyable::noncopyable((noncopyable *)this);
  this->loop_ = (EventLoop *)0x0;
  this->exiting_ = false;
  local_58 = threadFunc;
  local_50 = 0;
  local_60 = this;
  std::bind<void(EventLoopThread::*)(),EventLoopThread*>
            (&local_48,(offset_in_EventLoopThread_to_subr *)&local_58,&local_60);
  std::function<void()>::function<std::_Bind<void(EventLoopThread::*(EventLoopThread*))()>,void>
            ((function<void()> *)&local_30,&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"EventLoopThread",&local_91);
  Thread::Thread(&this->thread_,&local_30,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::function<void_()>::~function(&local_30);
  MutexLock::MutexLock(&this->mutex_);
  Condition::Condition(&this->cond_,&this->mutex_);
  return;
}

Assistant:

EventLoopThread::EventLoopThread()
    : loop_(NULL),
      exiting_(false),
      thread_(std::bind(&EventLoopThread::threadFunc, this), "EventLoopThread"),
      mutex_(),
      cond_(mutex_) {
}